

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O2

void __thiscall NaDynAr<double>::item::~item(item *this)

{
  double *pdVar1;
  
  pdVar1 = this->pData;
  if (pdVar1 == (double *)0x0) {
    NaPrintLog("data=0x%08p removed twice\n",0);
    pdVar1 = this->pData;
  }
  operator_delete(pdVar1,8);
  this->pData = (double *)0x0;
  return;
}

Assistant:

~item () {
      if(NULL == pData)
	NaPrintLog("data=0x%08p removed twice\n", pData);
      delete pData;
      pData = NULL;
    }